

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
AddExtension(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *filename,
            FieldDescriptorProto *field,pair<const_void_*,_int> value)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  string *psVar4;
  char *pcVar5;
  LogMessage *this_00;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  LogMessage *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffec0;
  second_type *in_stack_ffffffffffffff00;
  first_type *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  int in_stack_ffffffffffffff3c;
  LogMessage *in_stack_ffffffffffffff40;
  string local_78 [120];
  
  FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)0x5515fc);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)0x551619);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
    if (*pcVar5 == '.') {
      psVar4 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)0x55164f);
      std::__cxx11::string::substr((ulong)local_78,(ulong)psVar4);
      FieldDescriptorProto::number((FieldDescriptorProto *)0x551678);
      std::make_pair<std::__cxx11::string,int>
                (in_stack_fffffffffffffeb8,(int *)in_stack_fffffffffffffeb0);
      level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      bVar1 = InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,std::pair<void_const*,int>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>>
                        ((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff17,
                                     CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                         in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      bVar2 = bVar1 ^ 0xff;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x5516df);
      std::__cxx11::string::~string(local_78);
      if ((bVar2 & 1) != 0) {
        internal::LogMessage::LogMessage
                  (in_stack_fffffffffffffec0,level,(char *)in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeac);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffeb0,
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)0x551741);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffeb0,
                   (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffeb0,
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x551783);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffeb0,
                   (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffeb0,
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        FieldDescriptorProto::number((FieldDescriptorProto *)0x5517c5);
        internal::LogMessage::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffeb0,
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        this_00 = internal::LogMessage::operator<<
                            (in_stack_fffffffffffffeb0,
                             (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                            );
        internal::LogFinisher::operator=
                  ((LogFinisher *)this_00,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        internal::LogMessage::~LogMessage((LogMessage *)0x551832);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const std::string& filename, const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            std::make_pair(field.extendee().substr(1), field.number()),
            value)) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend "
                 << field.extendee() << " { " << field.name() << " = "
                 << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}